

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86.cpp
# Opt level: O0

int __thiscall ncnn::MatMul_x86::destroy_pipeline(MatMul_x86 *this,Option *opt)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0xd8) != 0) {
    (**(code **)(**(long **)(in_RDI + 0xd8) + 0x28))(*(long **)(in_RDI + 0xd8),in_RSI);
    if (*(long **)(in_RDI + 0xd8) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0xd8) + 8))();
    }
    *(undefined8 *)(in_RDI + 0xd8) = 0;
  }
  return 0;
}

Assistant:

int MatMul_x86::destroy_pipeline(const Option& opt)
{
    if (gemm)
    {
        gemm->destroy_pipeline(opt);
        delete gemm;
        gemm = 0;
    }

    return 0;
}